

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v7::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char cVar4;
  size_t sVar5;
  uint uVar6;
  result rVar7;
  type tVar8;
  uint64_t divisor;
  ulong uVar9;
  decimal_fp<float> dVar10;
  int iVar11;
  size_t count;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint64_t error;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  fp fVar18;
  fp fVar19;
  decimal_fp<double> dVar20;
  ulong uStackY_b0;
  uint local_90;
  int cached_exp10;
  fixed_handler handler;
  
  if (value < (longdouble)0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                ,0x980,"value is negative");
  }
  uVar12 = (ulong)specs & 0xff00000000;
  bVar17 = uVar12 == 0x200000000;
  if (value <= (longdouble)0) {
    if (precision < 1 || uVar12 != 0x200000000) {
      handler.buf = (char *)CONCAT71(handler.buf._1_7_,0x30);
      buffer<char>::push_back(buf,(char *)&handler);
      local_90 = 0;
    }
    else {
      tVar8 = to_unsigned<int>(precision);
      buffer<char>::try_resize(buf,(ulong)tVar8);
      memset(buf->ptr_,0x30,(ulong)(uint)precision);
      local_90 = -precision;
    }
  }
  else {
    uVar6 = specs._4_4_;
    if ((uVar6 >> 0x13 & 1) == 0) {
      local_90 = snprintf_float<long_double>(value,precision,specs,buf);
    }
    else if (precision < 0) {
      if ((uVar6 >> 0x12 & 1) == 0) {
        dVar20 = dragonbox::to_decimal<double>((double)value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long,_0>
                  ((buffer_appender<char>)buf,dVar20.significand);
        local_90 = dVar20.exponent;
      }
      else {
        dVar10 = dragonbox::to_decimal<float>((float)value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                  ((buffer_appender<char>)buf,dVar10.significand);
        local_90 = dVar10.exponent;
      }
    }
    else {
      cached_exp10 = 0;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = buf;
      fVar18 = normalize<0>((detail *)0x0,(fp)(auVar3 << 0x40));
      fVar19 = get_cached_power(-0x7c - fVar18.e,&cached_exp10);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = fVar19.f;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = fVar18.f;
      iVar11 = fVar19.e + fVar18.e;
      uVar16 = SUB168(auVar1 * auVar2,8) - (SUB168(auVar1 * auVar2,0) >> 0x3f);
      handler.buf = buf->ptr_;
      handler.precision = 0x2ff;
      if ((uint)precision < 0x2ff) {
        handler.precision = precision;
      }
      uVar9 = (ulong)(uint)-iVar11;
      handler.size = 0;
      handler.exp10 = -cached_exp10;
      uVar15 = uVar16 >> (uVar9 & 0x3f);
      handler.fixed = bVar17;
      if ((uint32_t)uVar15 == 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                    ,0x5ec,"");
      }
      if (uVar15 >> 0x20 != 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                    ,0x5ed,"");
      }
      uVar13 = (ulong)(-iVar11 - 0x40);
      local_90 = count_digits((uint32_t)uVar15);
      rVar7 = fixed_handler::on_start
                        (&handler,*(long *)(basic_data<void>::grisu_pow10_exponents +
                                           (long)(int)local_90 * 8 + 0xa8) << (uVar13 & 0x3f),
                         uVar16 / 10,10,(int *)&local_90);
      if (rVar7 == more) {
        divisor = 1L << (uVar9 & 0x3f);
        uVar9 = divisor - 1;
        uVar16 = uVar16 & uVar9;
        error = 1;
        do {
          uVar14 = local_90 - 1;
          switch((ulong)uVar14) {
          case 0:
            cVar4 = (char)uVar15;
            uVar15 = 0;
            goto LAB_00112f78;
          case 1:
            uStackY_b0 = 10;
            break;
          case 2:
            uStackY_b0 = 100;
            break;
          case 3:
            uStackY_b0 = 1000;
            break;
          case 4:
            uStackY_b0 = 10000;
            break;
          case 5:
            uStackY_b0 = 100000;
            break;
          case 6:
            uStackY_b0 = 1000000;
            break;
          case 7:
            uStackY_b0 = 10000000;
            break;
          case 8:
            uStackY_b0 = 100000000;
            break;
          case 9:
            uStackY_b0 = 1000000000;
            break;
          default:
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                        ,0x61f,"invalid number of digits");
          }
          cVar4 = (char)((uVar15 & 0xffffffff) / uStackY_b0);
          uVar15 = (uVar15 & 0xffffffff) % uStackY_b0;
LAB_00112f78:
          local_90 = uVar14;
          rVar7 = fixed_handler::on_digit
                            (&handler,cVar4 + '0',
                             *(long *)(basic_data<void>::powers_of_10_64 + (ulong)uVar14 * 8) <<
                             (uVar13 & 0x3f),(uVar15 << (uVar13 & 0x3f)) + uVar16,1,uVar14,true);
          if (rVar7 != more) goto LAB_0011300d;
        } while (0 < (int)local_90);
        do {
          uVar15 = uVar16 * 10;
          error = error * 10;
          uVar16 = uVar15 & uVar9;
          local_90 = local_90 - 1;
          rVar7 = fixed_handler::on_digit
                            (&handler,(char)(uVar15 >> (uVar13 & 0x3f)) + '0',divisor,uVar16,error,
                             local_90,false);
        } while (rVar7 == more);
      }
LAB_0011300d:
      if (rVar7 == error) {
        local_90 = local_90 + ~cached_exp10 + handler.size;
        fallback_format<long_double>
                  (value,handler.precision,(bool)((byte)(uVar6 >> 0x12) & 1),buf,(int *)&local_90);
      }
      else {
        local_90 = local_90 + handler.exp10;
        tVar8 = to_unsigned<int>(handler.size);
        buffer<char>::try_resize(buf,(ulong)tVar8);
      }
      if ((uVar6 >> 0x14 & 1) == 0 && uVar12 != 0x200000000) {
        sVar5 = buf->size_;
        uVar6 = local_90;
        do {
          local_90 = uVar6;
          count = sVar5;
          if (count == 0) break;
          sVar5 = count - 1;
          uVar6 = local_90 + 1;
        } while (buf->ptr_[count - 1] == '0');
        buffer<char>::try_resize(buf,count);
      }
    }
  }
  return local_90;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  // Use Grisu + Dragon4 for the given precision:
  // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  fp normalized = normalize(fp(value));
  const auto cached_pow = get_cached_power(
      min_exp - (normalized.e + fp::significand_size), cached_exp10);
  normalized = normalized * cached_pow;
  // Limit precision to the maximum possible number of significant digits in an
  // IEEE754 double because we don't need to generate zeros.
  const int max_double_digits = 767;
  if (precision > max_double_digits) precision = max_double_digits;
  fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
  if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error) {
    exp += handler.size - cached_exp10 - 1;
    fallback_format(value, handler.precision, specs.binary32, buf, exp);
  } else {
    exp += handler.exp10;
    buf.try_resize(to_unsigned(handler.size));
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}